

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O0

void __thiscall ProblemDecTiger::ConstructObservations(ProblemDecTiger *this)

{
  long in_RDI;
  string descr;
  string whatObs;
  string strAgentI;
  string strObsI;
  stringstream ss;
  string name;
  Index obsI;
  size_t nrObservationsThisAgent;
  Index agentIndex;
  size_t nrJointObservations;
  string *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_fffffffffffffcf8;
  Index IVar1;
  MultiAgentDecisionProcessDiscrete *this_00;
  char *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  allocator<char> *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  string local_2b0 [39];
  undefined1 local_289 [33];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  long local_1e8 [2];
  undefined1 local_1d8 [399];
  undefined1 local_49 [41];
  ulong local_20;
  uint local_14;
  long local_10;
  
  local_10 = 1;
  for (local_14 = 0; (ulong)local_14 < *(ulong *)(in_RDI + 0x50); local_14 = local_14 + 1) {
    local_20 = *(ulong *)(in_RDI + 0x230);
    local_10 = local_20 * local_10;
    for (local_49._37_4_ = 0; (uint)local_49._37_4_ < local_20;
        local_49._37_4_ = local_49._37_4_ + 1) {
      this_00 = (MultiAgentDecisionProcessDiscrete *)local_49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      std::allocator<char>::~allocator((allocator<char> *)local_49);
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
      std::__cxx11::string::string(local_208);
      std::__cxx11::string::string(local_228);
      std::ostream::operator<<(local_1d8,local_14);
      std::operator>>((istream *)local_1e8,local_228);
      std::__cxx11::string::operator+=((string *)(local_49 + 1),local_228);
      std::ios::clear((int)local_1e8 + (int)*(undefined8 *)(local_1e8[0] + -0x18));
      std::ostream::operator<<(local_1d8,local_49._37_4_);
      std::operator>>((istream *)local_1e8,local_208);
      std::__cxx11::string::operator+=((string *)(local_49 + 1),local_208);
      std::__cxx11::string::string(local_248);
      IVar1 = local_49._37_4_;
      if (local_49._37_4_ == 0) {
        std::__cxx11::string::operator=(local_248,"HearLeft");
      }
      else if (local_49._37_4_ == 1) {
        std::__cxx11::string::operator=(local_248,"HearRight");
      }
      std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      std::__cxx11::string::operator+=((string *)(local_49 + 1),local_268);
      std::__cxx11::string::~string(local_268);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_289;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      std::allocator<char>::~allocator((allocator<char> *)local_289);
      std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::__cxx11::string::operator+=((string *)(local_289 + 1),local_2b0);
      std::__cxx11::string::~string(local_2b0);
      std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(IVar1,in_stack_fffffffffffffcf8),__rhs);
      std::__cxx11::string::operator+=((string *)(local_289 + 1),(string *)&stack0xfffffffffffffd30)
      ;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd30);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd10);
      MultiAgentDecisionProcessDiscrete::AddObservation
                (this_00,IVar1,__rhs,in_stack_fffffffffffffce8);
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      std::__cxx11::string::~string((string *)(local_289 + 1));
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::__cxx11::string::~string((string *)(local_49 + 1));
    }
  }
  return;
}

Assistant:

void ProblemDecTiger::ConstructObservations()
{
    /// add observations:
    size_t nrJointObservations = 1;
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
        size_t nrObservationsThisAgent = NUMBER_OF_OBSERVATIONS;
        nrJointObservations *= nrObservationsThisAgent;
    
//         _m_nrObservations.push_back(nrObservationsThisAgent);
//         vector<ObservationDiscrete> ov_temp;
        //Again, this is copied into _m_observationVecs, so no 'new' needed
//        _m_observationVecs.push_back( ov_temp );
        for(Index obsI=0; obsI < nrObservationsThisAgent; obsI++)
        {
            string name("o");
            stringstream ss;
            string strObsI, strAgentI;        
            ss << agentIndex;
            ss >> strAgentI;
            name += strAgentI;
            ss.clear();
            ss << obsI;
            ss >> strObsI;
            name += strObsI; 
            string whatObs;
            switch(obsI){
            case(HEARLEFT):    whatObs = "HearLeft";
                break;
            case(HEARRIGHT):whatObs = "HearRight";
                break;
            }
            name += ":" + whatObs;
            
            string descr("Observation ");
            descr += whatObs + " - #";
            descr += strObsI + " of agent " + strAgentI;
//             ObservationDiscrete od_temp = ObservationDiscrete(obsI,name,descr);
//             _m_observationVecs[agentIndex].push_back( od_temp );
            AddObservation(agentIndex,name,descr);
            name.clear(); 
            strObsI.clear(); 
            strAgentI.clear(); 
            whatObs.clear();
            descr.clear();
        }
    }
}